

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::roll(Calendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  EDaysOfWeek EVar8;
  char *__s1;
  UDate UVar9;
  double dVar10;
  double y;
  EDaysOfWeek local_154;
  double local_118;
  double newtime_2;
  double gap2;
  double min2_2;
  int32_t postWeeks;
  int32_t preWeeks;
  double delta_2;
  double newtime_1;
  double min2_1;
  int32_t leadDays;
  double delta_1;
  double oneYear;
  double yearLength;
  double newtime;
  double min2;
  double delta;
  int32_t day_of_year;
  int32_t gap_2;
  int32_t limit_1;
  int32_t ldy;
  int32_t yearLen;
  int32_t start_2;
  int32_t fdy;
  int32_t dow_1;
  int32_t day_of_month;
  int32_t gap_1;
  int32_t limit;
  int32_t ldm;
  int32_t monthLen;
  int32_t start_1;
  int32_t fdm;
  int32_t dow;
  int32_t maxYear;
  int32_t newYear;
  char *calType;
  int32_t era;
  UBool era0WithYearsThatGoBackwards;
  int32_t mon;
  int32_t max_2;
  int32_t newHour;
  int32_t max_1;
  int32_t oldHour;
  double start;
  int32_t value;
  int32_t gap;
  int32_t max;
  int32_t min;
  UErrorCode *status_local;
  int32_t amount_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  undefined4 extraout_var;
  
  if (amount != 0) {
    complete(this,status);
    UVar2 = ::U_FAILURE(*status);
    if (UVar2 == '\0') {
      switch(field) {
      case UCAL_ERA:
      case UCAL_DATE:
      case UCAL_AM_PM:
      case UCAL_MINUTE:
      case UCAL_SECOND:
      case UCAL_MILLISECOND:
      case UCAL_MILLISECONDS_IN_DAY:
        iVar4 = (*(this->super_UObject)._vptr_UObject[0x15])(this,(ulong)field,status);
        iVar5 = (*(this->super_UObject)._vptr_UObject[0x16])(this,(ulong)field,status);
        iVar5 = (iVar5 - iVar4) + 1;
        iVar6 = internalGet(this,field);
        start._0_4_ = ((iVar6 + amount) - iVar4) % iVar5;
        if (start._0_4_ < 0) {
          start._0_4_ = iVar5 + start._0_4_;
        }
        set(this,field,iVar4 + start._0_4_);
        break;
      case UCAL_YEAR:
      case UCAL_YEAR_WOY:
        bVar1 = false;
        iVar6 = get(this,UCAL_ERA,status);
        status_local._0_4_ = amount;
        if (iVar6 == 0) {
          iVar4 = (*(this->super_UObject)._vptr_UObject[0x17])();
          __s1 = (char *)CONCAT44(extraout_var,iVar4);
          iVar4 = strcmp(__s1,"gregorian");
          if (((iVar4 == 0) || (iVar4 = strcmp(__s1,"roc"), iVar4 == 0)) ||
             (iVar4 = strcmp(__s1,"coptic"), iVar4 == 0)) {
            status_local._0_4_ = -amount;
            bVar1 = true;
          }
        }
        iVar7 = internalGet(this,field);
        dow = iVar7 + (int)status_local;
        if ((iVar6 < 1) && (dow < 1)) {
          if (bVar1) {
            dow = 1;
          }
        }
        else {
          iVar4 = (*(this->super_UObject)._vptr_UObject[0x16])(this,(ulong)field,status);
          if (iVar4 < 0x8000) {
            if (dow < 1) {
              dow = iVar4 - -dow % iVar4;
            }
            else if (iVar4 < dow) {
              dow = (dow + -1) % iVar4 + 1;
            }
          }
          else if (dow < 1) {
            dow = 1;
          }
        }
        set(this,field,dow);
        (*(this->super_UObject)._vptr_UObject[0x2c])(this,2,status);
        (*(this->super_UObject)._vptr_UObject[0x2c])(this,5,status);
        break;
      case UCAL_MONTH:
        iVar4 = (*(this->super_UObject)._vptr_UObject[0x16])(this,2,status);
        iVar6 = internalGet(this,UCAL_MONTH);
        era = (iVar6 + amount) % (iVar4 + 1);
        if (era < 0) {
          era = iVar4 + 1 + era;
        }
        set(this,UCAL_MONTH,era);
        (*(this->super_UObject)._vptr_UObject[0x2c])(this,5,status);
        break;
      case UCAL_WEEK_OF_YEAR:
        iVar6 = internalGet(this,UCAL_DAY_OF_WEEK);
        EVar8 = getFirstDayOfWeek(this);
        start_2 = iVar6 - EVar8;
        if (start_2 < 0) {
          start_2 = start_2 + 7;
        }
        iVar6 = internalGet(this,UCAL_DAY_OF_YEAR);
        yearLen = ((start_2 - iVar6) + 1) % 7;
        if (yearLen < 0) {
          yearLen = yearLen + 7;
        }
        bVar3 = getMinimalDaysInFirstWeek(this);
        if (7 - yearLen < (int)(uint)bVar3) {
          ldy = 8 - yearLen;
        }
        else {
          ldy = 1 - yearLen;
        }
        iVar4 = (*(this->super_UObject)._vptr_UObject[0x16])(this,6,status);
        iVar6 = internalGet(this,UCAL_DAY_OF_YEAR);
        iVar5 = ((iVar4 + 7) - ((iVar4 - iVar6) + start_2) % 7) - ldy;
        iVar6 = internalGet(this,UCAL_DAY_OF_YEAR);
        delta._0_4_ = ((iVar6 + amount * 7) - ldy) % iVar5;
        if (delta._0_4_ < 0) {
          delta._0_4_ = iVar5 + delta._0_4_;
        }
        delta._0_4_ = ldy + delta._0_4_;
        if (delta._0_4_ < 1) {
          delta._0_4_ = 1;
        }
        if (iVar4 < delta._0_4_) {
          delta._0_4_ = iVar4;
        }
        set(this,UCAL_DAY_OF_YEAR,delta._0_4_);
        clear(this,UCAL_MONTH);
        break;
      case UCAL_WEEK_OF_MONTH:
        iVar6 = internalGet(this,UCAL_DAY_OF_WEEK);
        EVar8 = getFirstDayOfWeek(this);
        start_1 = iVar6 - EVar8;
        if (start_1 < 0) {
          start_1 = start_1 + 7;
        }
        iVar6 = internalGet(this,UCAL_DATE);
        monthLen = ((start_1 - iVar6) + 1) % 7;
        if (monthLen < 0) {
          monthLen = monthLen + 7;
        }
        bVar3 = getMinimalDaysInFirstWeek(this);
        if (7 - monthLen < (int)(uint)bVar3) {
          ldm = 8 - monthLen;
        }
        else {
          ldm = 1 - monthLen;
        }
        iVar4 = (*(this->super_UObject)._vptr_UObject[0x16])(this,5,status);
        iVar6 = internalGet(this,UCAL_DATE);
        iVar5 = ((iVar4 + 7) - ((iVar4 - iVar6) + start_1) % 7) - ldm;
        iVar6 = internalGet(this,UCAL_DATE);
        fdy = ((iVar6 + amount * 7) - ldm) % iVar5;
        if (fdy < 0) {
          fdy = iVar5 + fdy;
        }
        fdy = ldm + fdy;
        if (fdy < 1) {
          fdy = 1;
        }
        if (iVar4 < fdy) {
          fdy = iVar4;
        }
        set(this,UCAL_DATE,fdy);
        break;
      case UCAL_DAY_OF_YEAR:
        iVar6 = internalGet(this,UCAL_DAY_OF_YEAR);
        UVar9 = internalGetTime(this);
        dVar10 = UVar9 - (double)(iVar6 + -1) * 86400000.0;
        iVar4 = (*(this->super_UObject)._vptr_UObject[0x16])(this,6,status);
        UVar9 = internalGetTime(this);
        yearLength = uprv_fmod_63((UVar9 + (double)amount * 86400000.0) - dVar10,
                                  (double)iVar4 * 86400000.0);
        if (yearLength < 0.0) {
          yearLength = (double)iVar4 * 86400000.0 + yearLength;
        }
        setTimeInMillis(this,yearLength + dVar10,status);
        break;
      case UCAL_DAY_OF_WEEK:
      case UCAL_DOW_LOCAL:
        iVar6 = internalGet(this,field);
        if (field == UCAL_DAY_OF_WEEK) {
          local_154 = getFirstDayOfWeek(this);
        }
        else {
          local_154 = SUNDAY;
        }
        min2_1._4_4_ = iVar6 - local_154;
        if (min2_1._4_4_ < 0) {
          min2_1._4_4_ = min2_1._4_4_ + 7;
        }
        UVar9 = internalGetTime(this);
        dVar10 = -(double)min2_1._4_4_ * 86400000.0 + UVar9;
        UVar9 = internalGetTime(this);
        delta_2 = uprv_fmod_63((UVar9 + (double)amount * 86400000.0) - dVar10,604800000.0);
        if (delta_2 < 0.0) {
          delta_2 = delta_2 + 604800000.0;
        }
        setTimeInMillis(this,delta_2 + dVar10,status);
        break;
      case UCAL_DAY_OF_WEEK_IN_MONTH:
        iVar6 = internalGet(this,UCAL_DATE);
        iVar4 = (iVar6 + -1) / 7;
        iVar5 = (*(this->super_UObject)._vptr_UObject[0x16])(this,5,status);
        iVar6 = internalGet(this,UCAL_DATE);
        UVar9 = internalGetTime(this);
        dVar10 = -(double)iVar4 * 604800000.0 + UVar9;
        y = (double)(iVar4 + (iVar5 - iVar6) / 7 + 1) * 604800000.0;
        UVar9 = internalGetTime(this);
        local_118 = uprv_fmod_63((UVar9 + (double)amount * 604800000.0) - dVar10,y);
        if (local_118 < 0.0) {
          local_118 = y + local_118;
        }
        setTimeInMillis(this,local_118 + dVar10,status);
        break;
      case UCAL_HOUR:
      case UCAL_HOUR_OF_DAY:
        dVar10 = getTimeInMillis(this,status);
        iVar6 = internalGet(this,field);
        iVar4 = (*(this->super_UObject)._vptr_UObject[0x10])(this,(ulong)field);
        mon = (iVar6 + amount) % (iVar4 + 1);
        if (mon < 0) {
          mon = iVar4 + 1 + mon;
        }
        setTimeInMillis(this,dVar10 + (double)((mon - iVar6) * 3600000),status);
        break;
      default:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        break;
      case UCAL_EXTENDED_YEAR:
        iVar6 = internalGet(this,field);
        set(this,field,iVar6 + amount);
        (*(this->super_UObject)._vptr_UObject[0x2c])(this,2,status);
        (*(this->super_UObject)._vptr_UObject[0x2c])(this,5,status);
        break;
      case UCAL_JULIAN_DAY:
        iVar6 = internalGet(this,field);
        set(this,field,iVar6 + amount);
      }
    }
  }
  return;
}

Assistant:

void Calendar::roll(UCalendarDateFields field, int32_t amount, UErrorCode& status)
{
    if (amount == 0) {
        return; // Nothing to do
    }

    complete(status);

    if(U_FAILURE(status)) {
        return;
    }
    switch (field) {
    case UCAL_DAY_OF_MONTH:
    case UCAL_AM_PM:
    case UCAL_MINUTE:
    case UCAL_SECOND:
    case UCAL_MILLISECOND:
    case UCAL_MILLISECONDS_IN_DAY:
    case UCAL_ERA:
        // These are the standard roll instructions.  These work for all
        // simple cases, that is, cases in which the limits are fixed, such
        // as the hour, the day of the month, and the era.
        {
            int32_t min = getActualMinimum(field,status);
            int32_t max = getActualMaximum(field,status);
            int32_t gap = max - min + 1;

            int32_t value = internalGet(field) + amount;
            value = (value - min) % gap;
            if (value < 0) {
                value += gap;
            }
            value += min;

            set(field, value);
            return;
        }

    case UCAL_HOUR:
    case UCAL_HOUR_OF_DAY:
        // Rolling the hour is difficult on the ONSET and CEASE days of
        // daylight savings.  For example, if the change occurs at
        // 2 AM, we have the following progression:
        // ONSET: 12 Std -> 1 Std -> 3 Dst -> 4 Dst
        // CEASE: 12 Dst -> 1 Dst -> 1 Std -> 2 Std
        // To get around this problem we don't use fields; we manipulate
        // the time in millis directly.
        {
            // Assume min == 0 in calculations below
            double start = getTimeInMillis(status);
            int32_t oldHour = internalGet(field);
            int32_t max = getMaximum(field);
            int32_t newHour = (oldHour + amount) % (max + 1);
            if (newHour < 0) {
                newHour += max + 1;
            }
            setTimeInMillis(start + kOneHour * (newHour - oldHour),status);
            return;
        }

    case UCAL_MONTH:
        // Rolling the month involves both pinning the final value
        // and adjusting the DAY_OF_MONTH if necessary.  We only adjust the
        // DAY_OF_MONTH if, after updating the MONTH field, it is illegal.
        // E.g., <jan31>.roll(MONTH, 1) -> <feb28> or <feb29>.
        {
            int32_t max = getActualMaximum(UCAL_MONTH, status);
            int32_t mon = (internalGet(UCAL_MONTH) + amount) % (max+1);

            if (mon < 0) {
                mon += (max + 1);
            }
            set(UCAL_MONTH, mon);

            // Keep the day of month in range.  We don't want to spill over
            // into the next month; e.g., we don't want jan31 + 1 mo -> feb31 ->
            // mar3.
            pinField(UCAL_DAY_OF_MONTH,status);
            return;
        }

    case UCAL_YEAR:
    case UCAL_YEAR_WOY:
        {
            // * If era==0 and years go backwards in time, change sign of amount.
            // * Until we have new API per #9393, we temporarily hardcode knowledge of
            //   which calendars have era 0 years that go backwards.
            UBool era0WithYearsThatGoBackwards = FALSE;
            int32_t era = get(UCAL_ERA, status);
            if (era == 0) {
                const char * calType = getType();
                if ( uprv_strcmp(calType,"gregorian")==0 || uprv_strcmp(calType,"roc")==0 || uprv_strcmp(calType,"coptic")==0 ) {
                    amount = -amount;
                    era0WithYearsThatGoBackwards = TRUE;
                }
            }
            int32_t newYear = internalGet(field) + amount;
            if (era > 0 || newYear >= 1) {
                int32_t maxYear = getActualMaximum(field, status);
                if (maxYear < 32768) {
                    // this era has real bounds, roll should wrap years
                    if (newYear < 1) {
                        newYear = maxYear - ((-newYear) % maxYear);
                    } else if (newYear > maxYear) {
                        newYear = ((newYear - 1) % maxYear) + 1;
                    }
                // else era is unbounded, just pin low year instead of wrapping
                } else if (newYear < 1) {
                    newYear = 1;
                }
            // else we are in era 0 with newYear < 1;
            // calendars with years that go backwards must pin the year value at 0,
            // other calendars can have years < 0 in era 0
            } else if (era0WithYearsThatGoBackwards) {
                newYear = 1;
            }
            set(field, newYear);
            pinField(UCAL_MONTH,status);
            pinField(UCAL_DAY_OF_MONTH,status);
            return;
        }

    case UCAL_EXTENDED_YEAR:
        // Rolling the year can involve pinning the DAY_OF_MONTH.
        set(field, internalGet(field) + amount);
        pinField(UCAL_MONTH,status);
        pinField(UCAL_DAY_OF_MONTH,status);
        return;

    case UCAL_WEEK_OF_MONTH:
        {
            // This is tricky, because during the roll we may have to shift
            // to a different day of the week.  For example:

            //    s  m  t  w  r  f  s
            //          1  2  3  4  5
            //    6  7  8  9 10 11 12

            // When rolling from the 6th or 7th back one week, we go to the
            // 1st (assuming that the first partial week counts).  The same
            // thing happens at the end of the month.

            // The other tricky thing is that we have to figure out whether
            // the first partial week actually counts or not, based on the
            // minimal first days in the week.  And we have to use the
            // correct first day of the week to delineate the week
            // boundaries.

            // Here's our algorithm.  First, we find the real boundaries of
            // the month.  Then we discard the first partial week if it
            // doesn't count in this locale.  Then we fill in the ends with
            // phantom days, so that the first partial week and the last
            // partial week are full weeks.  We then have a nice square
            // block of weeks.  We do the usual rolling within this block,
            // as is done elsewhere in this method.  If we wind up on one of
            // the phantom days that we added, we recognize this and pin to
            // the first or the last day of the month.  Easy, eh?

            // Normalize the DAY_OF_WEEK so that 0 is the first day of the week
            // in this locale.  We have dow in 0..6.
            int32_t dow = internalGet(UCAL_DAY_OF_WEEK) - getFirstDayOfWeek();
            if (dow < 0) dow += 7;

            // Find the day of the week (normalized for locale) for the first
            // of the month.
            int32_t fdm = (dow - internalGet(UCAL_DAY_OF_MONTH) + 1) % 7;
            if (fdm < 0) fdm += 7;

            // Get the first day of the first full week of the month,
            // including phantom days, if any.  Figure out if the first week
            // counts or not; if it counts, then fill in phantom days.  If
            // not, advance to the first real full week (skip the partial week).
            int32_t start;
            if ((7 - fdm) < getMinimalDaysInFirstWeek())
                start = 8 - fdm; // Skip the first partial week
            else
                start = 1 - fdm; // This may be zero or negative

            // Get the day of the week (normalized for locale) for the last
            // day of the month.
            int32_t monthLen = getActualMaximum(UCAL_DAY_OF_MONTH, status);
            int32_t ldm = (monthLen - internalGet(UCAL_DAY_OF_MONTH) + dow) % 7;
            // We know monthLen >= DAY_OF_MONTH so we skip the += 7 step here.

            // Get the limit day for the blocked-off rectangular month; that
            // is, the day which is one past the last day of the month,
            // after the month has already been filled in with phantom days
            // to fill out the last week.  This day has a normalized DOW of 0.
            int32_t limit = monthLen + 7 - ldm;

            // Now roll between start and (limit - 1).
            int32_t gap = limit - start;
            int32_t day_of_month = (internalGet(UCAL_DAY_OF_MONTH) + amount*7 -
                start) % gap;
            if (day_of_month < 0) day_of_month += gap;
            day_of_month += start;

            // Finally, pin to the real start and end of the month.
            if (day_of_month < 1) day_of_month = 1;
            if (day_of_month > monthLen) day_of_month = monthLen;

            // Set the DAY_OF_MONTH.  We rely on the fact that this field
            // takes precedence over everything else (since all other fields
            // are also set at this point).  If this fact changes (if the
            // disambiguation algorithm changes) then we will have to unset
            // the appropriate fields here so that DAY_OF_MONTH is attended
            // to.
            set(UCAL_DAY_OF_MONTH, day_of_month);
            return;
        }
    case UCAL_WEEK_OF_YEAR:
        {
            // This follows the outline of WEEK_OF_MONTH, except it applies
            // to the whole year.  Please see the comment for WEEK_OF_MONTH
            // for general notes.

            // Normalize the DAY_OF_WEEK so that 0 is the first day of the week
            // in this locale.  We have dow in 0..6.
            int32_t dow = internalGet(UCAL_DAY_OF_WEEK) - getFirstDayOfWeek();
            if (dow < 0) dow += 7;

            // Find the day of the week (normalized for locale) for the first
            // of the year.
            int32_t fdy = (dow - internalGet(UCAL_DAY_OF_YEAR) + 1) % 7;
            if (fdy < 0) fdy += 7;

            // Get the first day of the first full week of the year,
            // including phantom days, if any.  Figure out if the first week
            // counts or not; if it counts, then fill in phantom days.  If
            // not, advance to the first real full week (skip the partial week).
            int32_t start;
            if ((7 - fdy) < getMinimalDaysInFirstWeek())
                start = 8 - fdy; // Skip the first partial week
            else
                start = 1 - fdy; // This may be zero or negative

            // Get the day of the week (normalized for locale) for the last
            // day of the year.
            int32_t yearLen = getActualMaximum(UCAL_DAY_OF_YEAR,status);
            int32_t ldy = (yearLen - internalGet(UCAL_DAY_OF_YEAR) + dow) % 7;
            // We know yearLen >= DAY_OF_YEAR so we skip the += 7 step here.

            // Get the limit day for the blocked-off rectangular year; that
            // is, the day which is one past the last day of the year,
            // after the year has already been filled in with phantom days
            // to fill out the last week.  This day has a normalized DOW of 0.
            int32_t limit = yearLen + 7 - ldy;

            // Now roll between start and (limit - 1).
            int32_t gap = limit - start;
            int32_t day_of_year = (internalGet(UCAL_DAY_OF_YEAR) + amount*7 -
                start) % gap;
            if (day_of_year < 0) day_of_year += gap;
            day_of_year += start;

            // Finally, pin to the real start and end of the month.
            if (day_of_year < 1) day_of_year = 1;
            if (day_of_year > yearLen) day_of_year = yearLen;

            // Make sure that the year and day of year are attended to by
            // clearing other fields which would normally take precedence.
            // If the disambiguation algorithm is changed, this section will
            // have to be updated as well.
            set(UCAL_DAY_OF_YEAR, day_of_year);
            clear(UCAL_MONTH);
            return;
        }
    case UCAL_DAY_OF_YEAR:
        {
            // Roll the day of year using millis.  Compute the millis for
            // the start of the year, and get the length of the year.
            double delta = amount * kOneDay; // Scale up from days to millis
            double min2 = internalGet(UCAL_DAY_OF_YEAR)-1;
            min2 *= kOneDay;
            min2 = internalGetTime() - min2;

            //      double min2 = internalGetTime() - (internalGet(UCAL_DAY_OF_YEAR) - 1.0) * kOneDay;
            double newtime;

            double yearLength = getActualMaximum(UCAL_DAY_OF_YEAR,status);
            double oneYear = yearLength;
            oneYear *= kOneDay;
            newtime = uprv_fmod((internalGetTime() + delta - min2), oneYear);
            if (newtime < 0) newtime += oneYear;
            setTimeInMillis(newtime + min2, status);
            return;
        }
    case UCAL_DAY_OF_WEEK:
    case UCAL_DOW_LOCAL:
        {
            // Roll the day of week using millis.  Compute the millis for
            // the start of the week, using the first day of week setting.
            // Restrict the millis to [start, start+7days).
            double delta = amount * kOneDay; // Scale up from days to millis
            // Compute the number of days before the current day in this
            // week.  This will be a value 0..6.
            int32_t leadDays = internalGet(field);
            leadDays -= (field == UCAL_DAY_OF_WEEK) ? getFirstDayOfWeek() : 1;
            if (leadDays < 0) leadDays += 7;
            double min2 = internalGetTime() - leadDays * kOneDay;
            double newtime = uprv_fmod((internalGetTime() + delta - min2), kOneWeek);
            if (newtime < 0) newtime += kOneWeek;
            setTimeInMillis(newtime + min2, status);
            return;
        }
    case UCAL_DAY_OF_WEEK_IN_MONTH:
        {
            // Roll the day of week in the month using millis.  Determine
            // the first day of the week in the month, and then the last,
            // and then roll within that range.
            double delta = amount * kOneWeek; // Scale up from weeks to millis
            // Find the number of same days of the week before this one
            // in this month.
            int32_t preWeeks = (internalGet(UCAL_DAY_OF_MONTH) - 1) / 7;
            // Find the number of same days of the week after this one
            // in this month.
            int32_t postWeeks = (getActualMaximum(UCAL_DAY_OF_MONTH,status) -
                internalGet(UCAL_DAY_OF_MONTH)) / 7;
            // From these compute the min and gap millis for rolling.
            double min2 = internalGetTime() - preWeeks * kOneWeek;
            double gap2 = kOneWeek * (preWeeks + postWeeks + 1); // Must add 1!
            // Roll within this range
            double newtime = uprv_fmod((internalGetTime() + delta - min2), gap2);
            if (newtime < 0) newtime += gap2;
            setTimeInMillis(newtime + min2, status);
            return;
        }
    case UCAL_JULIAN_DAY:
        set(field, internalGet(field) + amount);
        return;
    default:
        // Other fields cannot be rolled by this method
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: ILLEGAL ARG because of roll on non-rollable field %s\n",
            __FILE__, __LINE__,fldName(field));
#endif
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
}